

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::DynamicMessageTest_Extensions_Test::TestBody
          (DynamicMessageTest_Extensions_Test *this)

{
  ParamType *pPVar1;
  MessageLite *pMVar2;
  ThreadSafeArena *arena_00;
  ReflectionTester reflection_tester;
  Arena arena;
  ReflectionTester local_140;
  ThreadSafeArena local_c0;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_c0);
  pMVar2 = &((this->super_DynamicMessageTest).extensions_prototype_)->super_MessageLite;
  pPVar1 = testing::WithParamInterface<std::tuple<bool,_bool>_>::GetParam();
  arena_00 = (ThreadSafeArena *)0x0;
  if ((pPVar1->super__Tuple_impl<0UL,_bool,_bool>).super__Head_base<0UL,_bool,_false>._M_head_impl
      != false) {
    arena_00 = &local_c0;
  }
  pMVar2 = MessageLite::New(pMVar2,(Arena *)arena_00);
  TestUtil::ReflectionTester::ReflectionTester
            (&local_140,(this->super_DynamicMessageTest).extensions_descriptor_);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&local_140,(Message *)pMVar2);
  TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection1(&local_140,(Message *)pMVar2);
  TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection2(&local_140,(Message *)pMVar2);
  TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection3(&local_140,(Message *)pMVar2);
  pPVar1 = testing::WithParamInterface<std::tuple<bool,_bool>_>::GetParam();
  if ((pPVar1->super__Tuple_impl<0UL,_bool,_bool>).super__Head_base<0UL,_bool,_false>._M_head_impl
      == false) {
    (*pMVar2->_vptr_MessageLite[1])(pMVar2);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_c0);
  return;
}

Assistant:

TEST_P(DynamicMessageTest, Extensions) {
  // Check that extensions work.
  Arena arena;
  Message* message = extensions_prototype_->New(use_arena() ? &arena : nullptr);
  TestUtil::ReflectionTester reflection_tester(extensions_descriptor_);

  reflection_tester.SetAllFieldsViaReflection(message);
  reflection_tester.ExpectAllFieldsSetViaReflection(*message);

  if (!use_arena()) {
    delete message;
  }
}